

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall
Omega_h::limit_gradation_once_tmpl<2,1>(Omega_h *this,Mesh *mesh,Reals *values,Real max_rate)

{
  LO LVar1;
  void *extraout_RDX;
  Reals RVar2;
  undefined1 local_100 [16];
  Write<double> out;
  Reals coords;
  type f;
  Graph v2v;
  
  Mesh::ask_star(&v2v,mesh,0);
  Mesh::coords((Mesh *)&coords);
  LVar1 = Mesh::nverts(mesh);
  std::__cxx11::string::string((string *)&f,"",(allocator *)local_100);
  Write<double>::Write(&out,LVar1,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<double>::Write((Write<double> *)&f,&values->write_);
  Write<double>::Write(&f.coords.write_,&coords.write_);
  Graph::Graph(&f.v2v,&v2v);
  f.max_rate = max_rate;
  Write<double>::Write(&f.out,&out);
  LVar1 = Mesh::nverts(mesh);
  parallel_for<Omega_h::limit_gradation_once_tmpl<2,1>(Omega_h::Mesh*,Omega_h::Read<double>,double)::_lambda(int)_1_>
            (LVar1,&f,"limit_metric_gradation");
  Write<double>::Write((Write<double> *)&stack0xffffffffffffff38,&out);
  Read<double>::Read((Read<signed_char> *)local_100,(Write<double> *)&stack0xffffffffffffff38);
  Write<double>::operator=(&values->write_,(Write<signed_char> *)local_100);
  Write<double>::~Write((Write<double> *)local_100);
  Write<double>::~Write((Write<double> *)&stack0xffffffffffffff38);
  Write<double>::Write((Write<double> *)&stack0xffffffffffffff28,&values->write_);
  Mesh::sync_array<double>
            ((Mesh *)local_100,(Int)mesh,(Read<double> *)0x0,(Int)&stack0xffffffffffffff28);
  Write<double>::operator=(&values->write_,(Write<signed_char> *)local_100);
  Write<double>::~Write((Write<double> *)local_100);
  Write<double>::~Write((Write<double> *)&stack0xffffffffffffff28);
  Write<double>::Write((Write<signed_char> *)this,(Write<signed_char> *)values);
  limit_gradation_once_tmpl<2,1>(Omega_h::Mesh*,Omega_h::Read<double>,double)::{lambda(int)#1}::
  ~Mesh((_lambda_int__1_ *)&f);
  Write<double>::~Write(&out);
  Write<double>::~Write(&coords.write_);
  Graph::~Graph(&v2v);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals limit_gradation_once_tmpl(
    Mesh* mesh, Reals values, Real max_rate) {
  auto v2v = mesh->ask_star(VERT);
  auto coords = mesh->coords();
  auto out = Write<Real>(mesh->nverts() * symm_ncomps(metric_dim));
  auto f = OMEGA_H_LAMBDA(LO v) {
    auto m = get_symm<metric_dim>(values, v);
    auto x = get_vector<mesh_dim>(coords, v);
    for (auto vv = v2v.a2ab[v]; vv < v2v.a2ab[v + 1]; ++vv) {
      auto av = v2v.ab2b[vv];
      auto am = get_symm<metric_dim>(values, av);
      auto ax = get_vector<mesh_dim>(coords, av);
      auto vec = ax - x;
      auto metric_dist = metric_length(am, vec);
      auto factor = metric_eigenvalue_from_length(1.0 + metric_dist * max_rate);
      auto limiter = am * factor;
      auto limited = intersect_metrics(m, limiter);
      m = limited;
    }
    set_symm(out, v, m);
  };
  parallel_for(mesh->nverts(), f, "limit_metric_gradation");
  values = Reals(out);
  values = mesh->sync_array(VERT, values, symm_ncomps(metric_dim));
  return values;
}